

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_vdpu1.c
# Opt level: O1

MPP_RET set_regs_parameters(AvsdHalCtx_t *p_hal,HalDecTask *task)

{
  RK_U32 *pRVar1;
  RK_S32 RVar2;
  uint uVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint *puVar13;
  RK_S32 idx;
  ulong uVar14;
  RK_S32 idx_00;
  int iVar15;
  
  pRVar1 = p_hal->p_regs;
  pRVar1[2] = pRVar1[2] | 0x800000;
  if (p_hal->work_out < 0) {
    RVar2 = get_queue_pic(p_hal);
    p_hal->work_out = RVar2;
    if (RVar2 < 0) {
      _mpp_log_l(2,"hal_avsd_plus","cannot get a pic_info buffer.\n","set_regs_parameters");
      return MPP_NOK;
    }
  }
  iVar15 = p_hal->work_out;
  p_hal->pic[iVar15].slot_idx = task->output;
  p_hal->pic[iVar15].pic_code_type = (p_hal->syn).pp.picCodingType;
  p_hal->pic[iVar15].picture_distance = (p_hal->syn).pp.pictureDistance;
  set_defalut_parameters(p_hal);
  pRVar1[4] = pRVar1[4] & 0x7fffff |
              (p_hal->syn).pp.horizontalSize * 0x80000 + 0x780000 & 0xff800000;
  uVar3 = pRVar1[3];
  pRVar1[3] = uVar3 & 0xfffffff | 0xb0000000;
  if ((p_hal->syn).pp.pictureStructure == 1) {
    uVar3 = uVar3 & 0xf37ffff | 0xb0000000;
  }
  else {
    pRVar1[3] = uVar3 & 0xf3fffff | 0xb0c00000;
    uVar3 = uVar3 & 0xf37ffff | 0xb0c00000;
    if ((p_hal->syn).pp.topFieldFirst == 0) {
      uVar3 = (uint)(p_hal->first_field == 0) << 0x13 | uVar3;
    }
    else {
      uVar3 = (p_hal->first_field & 1) << 0x13 | uVar3;
    }
  }
  pRVar1[3] = uVar3;
  pRVar1[4] = pRVar1[4] & 0xfff807ff | (p_hal->syn).pp.verticalSize * 0x80 + 0x780 & 0x7f800;
  pRVar1[7] = pRVar1[7] & 0xfdffffff | (p_hal->syn).pp.verticalSize * 0x2000 + 0x1e000 & 0x2000000;
  uVar6 = (uint)((p_hal->syn).pp.picCodingType == 2) << 0x15;
  pRVar1[3] = uVar6 | uVar3 & 0xffdfffff;
  pRVar1[3] = uVar6 | uVar3 & 0xffcfffff | (uint)((p_hal->syn).pp.picCodingType != 0) << 0x14;
  pRVar1[5] = pRVar1[5] & 0x3ffffff | p_hal->data_offset << 0x1d;
  *(byte *)&p_hal->data_offset = (byte)p_hal->data_offset & 0xf8;
  RVar4 = get_packet_fd(p_hal,task->input);
  pRVar1[0xc] = RVar4;
  mpp_dev_set_reg_offset(p_hal->dev,0xc,p_hal->data_offset);
  uVar6 = (uint)*(byte *)((long)pRVar1 + 0x1b) << 0x18;
  uVar3 = (p_hal->syn).bitstream_size - p_hal->data_offset & 0xffffff;
  pRVar1[6] = uVar3 | uVar6;
  pRVar1[3] = pRVar1[3] & 0xffffdfff | ((p_hal->syn).pp.fixedPictureQp & 1) << 0xd;
  pRVar1[6] = uVar3 | uVar6 & 0x81ffffff | ((p_hal->syn).pp.pictureQp & 0x3f) << 0x19;
  RVar4 = (p_hal->syn).pp.profileId;
  uVar3 = pRVar1[0x2c];
  uVar6 = (uint)(RVar4 == 0x48) << 0x1a;
  pRVar1[0x2c] = uVar6 | uVar3 & 0xfbffffff;
  if (RVar4 == 0x48) {
    uVar7 = ((p_hal->syn).pp.weightingQuantFlag & 1) << 0x19;
    pRVar1[0x2c] = uVar6 | uVar3 & 0xf9ffffff | uVar7;
    uVar8 = ((p_hal->syn).pp.aecEnable & 1) << 0x16;
    pRVar1[0x2c] = uVar6 | uVar3 & 0xf9bfffff | uVar7 | uVar8;
    uVar9 = ((p_hal->syn).pp.noForwardReferenceFlag & 1) << 0x15;
    pRVar1[0x2c] = uVar6 | uVar3 & 0xf99fffff | uVar7 | uVar8 | uVar9;
    uVar10 = ((p_hal->syn).pp.pbFieldEnhancedFlag & 1) << 0x14;
    pRVar1[0x2c] = uVar6 | uVar3 & 0xf98fffff | uVar7 | uVar8 | uVar9 | uVar10;
    if (((p_hal->syn).pp.weightingQuantFlag == 0) || ((p_hal->syn).pp.chromaQuantParamDisable != 0))
    {
      uVar10 = uVar6 | uVar3 & 0xf98000ff | uVar7 | uVar8 | uVar9 | uVar10;
    }
    else {
      uVar11 = ((p_hal->syn).pp.chromaQuantParamDeltaCb & 0x3fU) << 0xe;
      pRVar1[0x2c] = uVar6 | uVar3 & 0xf9803fff | uVar7 | uVar8 | uVar9 | uVar10 | uVar11;
      uVar10 = uVar6 | uVar3 & 0xf98000ff | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 |
               ((p_hal->syn).pp.chromaQuantParamDeltaCr & 0x3fU) << 8;
    }
    pRVar1[0x2c] = uVar10;
    if ((p_hal->syn).pp.weightingQuantFlag != 0) {
      uVar3 = uVar10 & 0xfe7fffff | ((p_hal->syn).pp.weightingQuantModel & 3) << 0x17;
      pRVar1[0x2c] = uVar3;
      pRVar1[0x2c] = CONCAT31((int3)(uVar3 >> 8),(char)(p_hal->syn).pp.weightingQuantParam[0]);
      *(char *)((long)pRVar1 + 0xab) = (char)(p_hal->syn).pp.weightingQuantParam[1];
      uVar6 = (p_hal->syn).pp.weightingQuantParam[2] << 0x18;
      uVar3 = pRVar1[0x2b];
      pRVar1[0x2b] = uVar3 & 0xffffff | uVar6;
      uVar10 = ((p_hal->syn).pp.weightingQuantParam[3] & 0xff) << 0x10;
      pRVar1[0x2b] = uVar3 & 0xffff | uVar6 | uVar10;
      uVar3 = uVar3 & 0xff | uVar6 | uVar10 | ((p_hal->syn).pp.weightingQuantParam[4] & 0xff) << 8;
      pRVar1[0x2b] = uVar3;
      pRVar1[0x2b] = CONCAT31((int3)(uVar3 >> 8),(char)(p_hal->syn).pp.weightingQuantParam[5]);
    }
  }
  if (((p_hal->syn).pp.pictureStructure == 1) || (p_hal->first_field != 0)) {
    RVar4 = get_frame_fd(p_hal,task->output);
    pRVar1[0xd] = RVar4;
  }
  else {
    RVar4 = (p_hal->syn).pp.horizontalSize;
    RVar5 = get_frame_fd(p_hal,task->output);
    pRVar1[0xd] = RVar5;
    mpp_dev_set_reg_offset(p_hal->dev,0xd,RVar4);
  }
  iVar15 = task->refer[0];
  if (iVar15 < 0) {
    iVar15 = task->output;
  }
  RVar2 = task->refer[1];
  if (task->refer[1] < 0) {
    RVar2 = iVar15;
  }
  idx = iVar15;
  idx_00 = RVar2;
  if (((p_hal->first_field == 0) && ((p_hal->syn).pp.pictureStructure == 0)) &&
     ((p_hal->syn).pp.picCodingType != 2)) {
    idx = task->output;
    idx_00 = iVar15;
  }
  RVar4 = get_frame_fd(p_hal,idx);
  pRVar1[0xe] = RVar4;
  RVar4 = get_frame_fd(p_hal,iVar15);
  pRVar1[0xf] = RVar4;
  RVar4 = get_frame_fd(p_hal,idx_00);
  pRVar1[0x10] = RVar4;
  RVar4 = get_frame_fd(p_hal,RVar2);
  pRVar1[0x11] = RVar4;
  RVar4 = (p_hal->syn).pp.picCodingType;
  uVar3 = p_hal->work0;
  if ((p_hal->syn).pp.pictureStructure == 1) {
    if (RVar4 == 2) {
      if ((int)uVar3 < 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (p_hal->pic[uVar3].picture_distance - (p_hal->syn).pp.pictureDistance & 0xff) * 2;
      }
      uVar12 = (ulong)uVar3;
      if (uVar3 == 0) {
        uVar12 = 2;
      }
      pRVar1[0x1f] = (uint)uVar12 << 0x10 | (uint)uVar12;
      uVar3 = (uint)(0x200 / uVar12);
      pRVar1[0x1d] = uVar3 << 0x10 | uVar3;
      if ((-1 < (long)p_hal->work1) &&
         (uVar3 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff
         , uVar12 = (ulong)(uVar3 * 2), uVar3 == 0)) {
        uVar12 = 2;
      }
      pRVar1[0x1e] = (uint)uVar12 << 0x10 | (uint)uVar12;
      uVar3 = (uint)(0x200 / uVar12);
      pRVar1[0x1c] = uVar3 << 0x10 | uVar3;
      if ((-1 < (long)p_hal->work0) && (-1 < (long)p_hal->work1)) {
        uVar3 = p_hal->pic[p_hal->work0].picture_distance -
                p_hal->pic[p_hal->work1].picture_distance & 0xff;
        uVar12 = 2;
        if (uVar3 != 0) {
          uVar12 = (ulong)(uVar3 * 2);
        }
      }
      pRVar1[0x20] = (int)(0x4000 / uVar12) * 0x10001;
      uVar6 = (uint)(0x4000 / (long)p_hal->future2prev_past_dist);
      uVar3 = uVar6;
LAB_001e6283:
      uVar3 = uVar6 << 0x10 | uVar3 & 0xffff;
LAB_001e65e9:
      pRVar1[0x21] = uVar3;
    }
    else {
      if ((int)uVar3 < 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = ((p_hal->syn).pp.pictureDistance - p_hal->pic[uVar3].picture_distance & 0xff) * 2;
      }
      uVar12 = (ulong)uVar3;
      if (uVar3 == 0) {
        uVar12 = 2;
      }
      uVar3 = (uint)uVar12;
      pRVar1[0x1e] = uVar3 << 0x10 | uVar3;
      uVar6 = (uint)(0x200 / uVar12);
      pRVar1[0x1c] = uVar6 << 0x10 | uVar6;
      if ((-1 < (long)p_hal->work1) &&
         (uVar6 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff
         , uVar3 = uVar6 * 2, uVar6 == 0)) {
        uVar3 = 2;
      }
      p_hal->future2prev_past_dist = uVar3;
      pRVar1[0x1f] = uVar3 << 0x10 | uVar3;
      pRVar1[0x1d] = (int)(0x200 / (ulong)uVar3) * 0x10001;
LAB_001e657f:
      pRVar1[0x20] = 0;
      pRVar1[0x21] = 0;
    }
  }
  else {
    if (RVar4 != 2) {
      if ((int)uVar3 < 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = ((p_hal->syn).pp.pictureDistance - p_hal->pic[uVar3].picture_distance & 0xff) * 2;
      }
      uVar12 = 2;
      if (uVar3 != 0) {
        uVar12 = (ulong)uVar3;
      }
      uVar3 = (uint)uVar12;
      if (p_hal->first_field == 0) {
        *(undefined2 *)(pRVar1 + 0x1e) = 1;
        *(short *)(pRVar1 + 0x1f) = (short)(uVar3 | 1);
        *(undefined2 *)(pRVar1 + 0x1c) = 0x200;
        uVar6 = (uint)(0x200 / (ulong)(uVar3 | 1));
        puVar13 = pRVar1 + 0x1d;
      }
      else {
        *(short *)(pRVar1 + 0x1e) = (short)(uVar3 - 1);
        puVar13 = pRVar1 + 0x1c;
        uVar6 = (uint)(0x200 / (long)(int)(uVar3 - 1)) & 0xffff;
      }
      *puVar13 = (uint)*(ushort *)((long)puVar13 + 2) << 0x10 | uVar6;
      *(short *)((long)pRVar1 + 0x7a) = (short)uVar12;
      *(short *)((long)pRVar1 + 0x72) = (short)(0x200 / uVar12);
      if (-1 < (long)p_hal->work1) {
        uVar6 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff;
        uVar3 = 2;
        if (uVar6 != 0) {
          uVar3 = uVar6 * 2;
        }
      }
      p_hal->future2prev_past_dist = uVar3;
      if (p_hal->first_field == 0) {
        *(short *)((long)pRVar1 + 0x7e) = (short)uVar3;
        iVar15 = (int)(0x200 / (ulong)uVar3);
        uVar6 = (uint)(ushort)pRVar1[0x1d];
      }
      else {
        pRVar1[0x1f] = uVar3 << 0x10 | uVar3 - 1 & 0xffff;
        uVar6 = (uint)(0x200 / (long)(int)(uVar3 - 1)) & 0xffff;
        iVar15 = (int)(0x200 / (ulong)uVar3);
      }
      pRVar1[0x1d] = iVar15 << 0x10 | uVar6;
      goto LAB_001e657f;
    }
    if ((int)uVar3 < 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (p_hal->pic[uVar3].picture_distance - (p_hal->syn).pp.pictureDistance & 0xff) * 2;
    }
    uVar12 = 2;
    if (uVar3 != 0) {
      uVar12 = (ulong)uVar3;
    }
    uVar3 = (uint)uVar12;
    if (p_hal->first_field == 0) {
      pRVar1[0x1f] = uVar3 << 0x10 | uVar3 - 1 & 0xffff;
      uVar6 = (uint)(0x200 / (long)(int)(uVar3 - 1)) & 0xffff;
    }
    else {
      pRVar1[0x1f] = (uVar3 | 1) << 0x10 | uVar3;
      uVar6 = (uint)(0x200 / uVar12);
      uVar3 = uVar3 | 1;
    }
    pRVar1[0x1d] = (int)(0x200 / (ulong)uVar3) << 0x10 | uVar6;
    if (-1 < (long)p_hal->work1) {
      uVar3 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff;
      uVar12 = 2;
      if (uVar3 != 0) {
        uVar12 = (ulong)(uVar3 * 2);
      }
    }
    uVar3 = (uint)uVar12;
    if (p_hal->first_field == 0) {
      uVar14 = (ulong)(uVar3 + 1);
      pRVar1[0x1e] = (uVar3 + 1) * 0x10000 | uVar3;
      uVar3 = (uint)(0x200 / uVar12);
    }
    else {
      pRVar1[0x1e] = uVar3 << 0x10 | uVar3 - 1 & 0xffff;
      uVar3 = (uint)(0x200 / (long)(int)(uVar3 - 1)) & 0xffff;
      uVar14 = uVar12;
    }
    pRVar1[0x1c] = (int)(0x200 / uVar14) << 0x10 | uVar3;
    if ((-1 < (long)p_hal->work0) && (-1 < (long)p_hal->work1)) {
      uVar3 = p_hal->pic[p_hal->work0].picture_distance - p_hal->pic[p_hal->work1].picture_distance
              & 0xff;
      uVar12 = 2;
      if (uVar3 != 0) {
        uVar12 = (ulong)(uVar3 * 2);
      }
    }
    iVar15 = (int)uVar12;
    if (((p_hal->syn).pp.pbFieldEnhancedFlag != 0) && (p_hal->first_field == 0)) {
      pRVar1[0x20] = (int)(0x4000 / uVar12) << 0x10 | (uint)(0x4000 / (long)(iVar15 + -1)) & 0xffff;
      uVar3 = (uint)(0x4000 / (long)(p_hal->future2prev_past_dist + -1));
      uVar6 = (uint)(0x4000 / (long)p_hal->future2prev_past_dist);
      goto LAB_001e6283;
    }
    if (p_hal->first_field == 0) {
      pRVar1[0x20] = (int)(0x4000 / uVar12) << 0x10 | 0x4000;
      *(short *)(pRVar1 + 0x21) = (short)(0x4000 / (ulong)(iVar15 + 1));
    }
    else {
      pRVar1[0x20] = (int)(0x4000 / uVar12) << 0x10 | (uint)(0x4000 / (long)(iVar15 + -1)) & 0xffff;
    }
    iVar15 = p_hal->future2prev_past_dist;
    if (p_hal->first_field != 0) {
      uVar3 = (int)(0x4000 / (long)iVar15) << 0x10 | (uint)(0x4000 / (long)(iVar15 + -1)) & 0xffff;
      goto LAB_001e65e9;
    }
    *(short *)((long)pRVar1 + 0x86) = (short)(0x4000 / (long)iVar15);
  }
  if ((*(byte *)((long)pRVar1 + 0xb3) & 4) != 0) {
    uVar3 = (uint)*(byte *)((long)pRVar1 + 0xab) << 0x18;
    pRVar1[0x2a] = uVar3;
    if (((p_hal->syn).pp.pictureStructure == 0) && ((p_hal->syn).pp.picCodingType == 2)) {
      pRVar1[0x2a] = uVar3 | 0x410000;
      uVar6 = 0x410400;
      if (p_hal->first_field == 0) {
        uVar6 = 0x410036;
      }
      pRVar1[0x2a] = uVar6 | uVar3;
    }
  }
  pRVar1[0x30] = pRVar1[0x30] & 0x3fff;
  uVar10 = ((p_hal->syn).pp.loopFilterDisable & 1) << 0xe;
  uVar3 = pRVar1[3];
  pRVar1[3] = uVar3 & 0xffffbfff | uVar10;
  uVar7 = ((p_hal->syn).pp.alphaOffset & 0x1fU) << 5;
  uVar6 = pRVar1[5];
  pRVar1[5] = uVar6 & 0xfffffc1f | uVar7;
  pRVar1[5] = uVar6 & 0xfffffc00 | uVar7 | (p_hal->syn).pp.betaOffset & 0x1fU;
  uVar7 = ((p_hal->syn).pp.skipModeFlag & 1) << 0x1a;
  uVar6 = uVar3 & 0xfbffbfff | uVar10 | uVar7;
  pRVar1[3] = uVar6;
  pRVar1[4] = pRVar1[4] & 0xfffffffe | (p_hal->syn).pp.pictureReferenceFlag & 1;
  pRVar1[3] = uVar3 & 0xfbffafff | uVar10 | uVar7;
  uVar3 = (p_hal->syn).pp.picCodingType;
  if ((*(byte *)((long)pRVar1 + 0xb3) & 4) == 0) {
    if ((uVar3 != 1) && ((uVar3 != 0 || (p_hal->first_field != 0)))) goto LAB_001e6708;
  }
  else if (1 < uVar3) goto LAB_001e6708;
  pRVar1[3] = uVar6 | 0x1000;
LAB_001e6708:
  if ((p_hal->first_field == 0) &&
     (((p_hal->syn).pp.picCodingType != 2 || (p_hal->prev_pic_structure == 0)))) {
    RVar4 = (p_hal->syn).pp.horizontalSize;
    RVar5 = (p_hal->syn).pp.verticalSize;
    if ((p_hal->syn).pp.progressiveFrame == 0) {
      uVar3 = RVar5 + 0x1f >> 4 & 0xfffffffe;
    }
    else {
      uVar3 = RVar5 + 0xf >> 4;
    }
    RVar5 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar1[0x29] = RVar5;
    mpp_dev_set_reg_offset
              (p_hal->dev,0x29,(RVar4 + 0xf >> 1 & 0xfffffff8) * uVar3 + 0x10 & 0xffffffe0);
  }
  else {
    RVar4 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar1[0x29] = RVar4;
  }
  if ((*(byte *)((long)pRVar1 + 0xb3) & 4) != 0) {
    RVar4 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar1[0x2d] = RVar4;
  }
  uVar3 = 1;
  if (((-1 < (long)p_hal->work0) && (p_hal->pic[p_hal->work0].pic_type != 0)) &&
     (uVar3 = 0, p_hal->first_field == 0)) {
    uVar3 = (uint)(p_hal->prev_pic_structure == 0);
  }
  pRVar1[0x12] = pRVar1[0x12] & 0xfffffffe | uVar3;
  if (p_hal->prev_pic_structure == 0) {
    mpp_dev_set_reg_offset(p_hal->dev,0x10,2);
    mpp_dev_set_reg_offset(p_hal->dev,0x11,3);
  }
  *(byte *)((long)pRVar1 + 0xd) = *(byte *)((long)pRVar1 + 0xd) & 0x7f;
  *(byte *)(pRVar1 + 1) = (byte)pRVar1[1] | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET set_regs_parameters(AvsdHalCtx_t *p_hal, HalDecTask *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    AvsdSyntax_t *p_syn = &p_hal->syn;
    AvsdVdpu1Regs_t *p_regs = (AvsdVdpu1Regs_t *)p_hal->p_regs;

    set_defalut_parameters(p_hal);

    p_regs->sw02.dec_timeout_e = 1;
    p_regs->sw02.dec_clk_gate_e = 1;
    p_regs->sw01.dec_irq_dis = 0;
    p_regs->sw03.rlc_mode_e = 0;

    //!< set wrok_out pic info
    if (p_hal->work_out < 0) {
        p_hal->work_out = get_queue_pic(p_hal);
        if (p_hal->work_out < 0) {
            ret = MPP_NOK;
            mpp_err_f("cannot get a pic_info buffer.\n");
            goto __FAILED;
        }
    }
    {
        AvsdHalPic_t *p_work_out = &p_hal->pic[p_hal->work_out];

        p_work_out->slot_idx = task->output;
        p_work_out->pic_code_type = p_syn->pp.picCodingType;
        p_work_out->picture_distance = p_syn->pp.pictureDistance;
    }
    //!< set register
    p_regs->sw04.pic_mb_width = (p_syn->pp.horizontalSize + 15) >> 4;
    p_regs->sw03.dec_mode = 11; //!< DEC_MODE_AVS

    if (p_syn->pp.pictureStructure == FRAMEPICTURE) {
        p_regs->sw03.pic_interlace_e = 0;
        p_regs->sw03.pic_fieldmode_e = 0;
        p_regs->sw03.pic_topfiled_e = 0;
    } else {
        p_regs->sw03.pic_interlace_e = 1;
        p_regs->sw03.pic_fieldmode_e = 1;
        p_regs->sw03.pic_topfiled_e = p_hal->first_field;
    }

    p_regs->sw04.pic_mb_height_p = (p_syn->pp.verticalSize + 15) >> 4;
    //p_regs->sw07.avs_h_ext = (p_syn->pp.verticalSize + 15) >> 12;

    if (p_syn->pp.picCodingType == BFRAME) {
        p_regs->sw03.pic_b_e = 1;
    } else {
        p_regs->sw03.pic_b_e = 0;
    }
    p_regs->sw03.pic_inter_e = (p_syn->pp.picCodingType != IFRAME) ? 1 : 0;

    mpp_log("data_offset %x\n", p_hal->data_offset);
    p_regs->sw05.strm_start_bit = 8 * (p_hal->data_offset & 0x7);
    p_hal->data_offset = (p_hal->data_offset & ~0x7);
    p_regs->sw12.rlc_vlc_base = get_packet_fd(p_hal, task->input);
    mpp_dev_set_reg_offset(p_hal->dev, 12, p_hal->data_offset);
    p_regs->sw06.stream_len = p_syn->bitstream_size - p_hal->data_offset;
    p_regs->sw03.pic_fixed_quant = p_syn->pp.fixedPictureQp;
    p_regs->sw06.init_qp = p_syn->pp.pictureQp;

    p_regs->sw13.dec_out_base = get_frame_fd(p_hal, task->output);
    if (p_syn->pp.pictureStructure == FIELDPICTURE && !p_hal->first_field) {
        //!< start of bottom field line
        mpp_dev_set_reg_offset(p_hal->dev, 13, p_syn->pp.horizontalSize);
    }
    {
        RK_S32 tmp_fwd = -1;
        RK_S32 refer0 = -1;
        RK_S32 refer1 = -1;

        tmp_fwd = (p_hal->work1 < 0) ? p_hal->work0 : p_hal->work1;
        tmp_fwd = (tmp_fwd < 0) ? p_hal->work_out : tmp_fwd;

        refer0 = (task->refer[0] < 0) ? task->output : task->refer[0];
        refer1 = (task->refer[1] < 0) ? refer0 : task->refer[1];
        if (!p_hal->first_field
            && p_syn->pp.pictureStructure == FIELDPICTURE
            && p_syn->pp.picCodingType != BFRAME) {
            p_regs->sw14.refer0_base = get_frame_fd(p_hal, task->output);
            p_regs->sw15.refer1_base = get_frame_fd(p_hal, refer0);
            p_regs->sw16.refer2_base = get_frame_fd(p_hal, refer0);
            p_regs->sw17.refer3_base = get_frame_fd(p_hal, refer1);
        } else {
            p_regs->sw14.refer0_base = get_frame_fd(p_hal, refer0);
            p_regs->sw15.refer1_base = get_frame_fd(p_hal, refer0);
            p_regs->sw16.refer2_base = get_frame_fd(p_hal, refer1);
            p_regs->sw17.refer3_base = get_frame_fd(p_hal, refer1);
        }
    }
    //!< block distances
    if (p_syn->pp.pictureStructure == FRAMEPICTURE) {
        if (p_syn->pp.picCodingType == BFRAME) {
            RK_S32 tmp = 0;
            //!< current to future anchor
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_syn->pp.pictureDistance + 512) & 0x1FF;
            }
            //!< prevent division by zero
            if (!tmp) tmp = 2;
            p_regs->sw31.ref_dist_cur_2 = tmp;
            p_regs->sw31.ref_dist_cur_3 = tmp;
            p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
            p_regs->sw29.ref_invd_cur_3 = 512 / tmp;

            //!< current to past anchor
            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            p_regs->sw30.ref_dist_cur_0 = tmp;
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            //!< future anchor to past anchor
            if (p_hal->work0 >= 0 && p_hal->work1 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            tmp = 16384 / tmp;
            p_regs->sw32.ref_invd_col_0 = tmp;
            p_regs->sw32.ref_invd_col_1 = tmp;
            //!< future anchor to previous past anchor
            tmp = p_hal->future2prev_past_dist;
            tmp = 16384 / tmp;
            p_regs->sw33.ref_invd_col_2 = tmp;
            p_regs->sw33.ref_invd_col_3 = tmp;
        } else {
            RK_S32 tmp = 0;
            //!< current to past anchor
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work0].picture_distance - 512) & 0x1FF;
            }
            if (!tmp) tmp = 2;
            p_regs->sw30.ref_dist_cur_0 = tmp;
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            //!< current to previous past anchor
            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< this will become "future to previous past" for next B
            p_hal->future2prev_past_dist = tmp;

            p_regs->sw31.ref_dist_cur_2 = tmp;
            p_regs->sw31.ref_dist_cur_3 = tmp;
            p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
            p_regs->sw29.ref_invd_cur_3 = 512 / tmp;

            p_regs->sw32.ref_invd_col_0 = 0;
            p_regs->sw32.ref_invd_col_1 = 0;
            p_regs->sw33.ref_invd_col_2 = 0;
            p_regs->sw33.ref_invd_col_3 = 0;
        }
    } else {
        //!< field interlaced
        if (p_syn->pp.picCodingType == BFRAME) {
            RK_S32 tmp = 0;
            //!< block distances
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_syn->pp.pictureDistance + 512) & 0x1FF;
            }
            //!< prevent division by zero
            if (!tmp) tmp = 2;

            if (p_hal->first_field) {
                p_regs->sw31.ref_dist_cur_2 = tmp;
                p_regs->sw31.ref_dist_cur_3 = tmp + 1;
                p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
                p_regs->sw29.ref_invd_cur_3 = 512 / (tmp + 1);
            } else {
                p_regs->sw31.ref_dist_cur_2 = tmp - 1;
                p_regs->sw31.ref_dist_cur_3 = tmp;
                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp - 1);
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            }

            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            if (p_hal->first_field) {
                p_regs->sw30.ref_dist_cur_0 = (tmp - 1);
                p_regs->sw30.ref_dist_cur_1 = tmp;
                p_regs->sw28.ref_invd_cur_0 = 512 / (tmp - 1);
                p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            } else {
                p_regs->sw30.ref_dist_cur_0 = tmp;
                p_regs->sw30.ref_dist_cur_1 = tmp + 1;
                p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
                p_regs->sw28.ref_invd_cur_1 = 512 / (tmp + 1);
            }

            if (p_hal->work0 >= 0 && p_hal->work1 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }

            if (p_syn->pp.pbFieldEnhancedFlag && !p_hal->first_field) {
                //!< in this case, BlockDistanceRef is different with before, the mvRef points to top field
                p_regs->sw32.ref_invd_col_0 = 16384 / (tmp - 1);
                p_regs->sw32.ref_invd_col_1 = 16384 / tmp;

                //!< future anchor to previous past anchor
                tmp = p_hal->future2prev_past_dist;

                p_regs->sw33.ref_invd_col_2 = 16384 / (tmp - 1);
                p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
            } else {
                if (p_hal->first_field) {
                    p_regs->sw32.ref_invd_col_0 = 16384 / (tmp - 1);
                    p_regs->sw32.ref_invd_col_1 = 16384 / tmp;
                } else {
                    p_regs->sw32.ref_invd_col_0 = 16384;
                    p_regs->sw32.ref_invd_col_1 = 16384 / tmp;
                    p_regs->sw33.ref_invd_col_2 = 16384 / (tmp + 1);
                }

                //!< future anchor to previous past anchor
                tmp = p_hal->future2prev_past_dist;

                if (p_hal->first_field) {
                    p_regs->sw33.ref_invd_col_2 = 16384 / (tmp - 1);
                    p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
                } else {
                    p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
                }
            }
        } else {
            RK_S32 tmp = 0;
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work0].picture_distance - 512) & 0x1FF;
            }
            if (!tmp) tmp = 2;

            if (!p_hal->first_field) {
                p_regs->sw30.ref_dist_cur_0 = 1;
                p_regs->sw31.ref_dist_cur_2 = tmp + 1;

                p_regs->sw28.ref_invd_cur_0 = 512;
                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp + 1);
            } else {
                p_regs->sw30.ref_dist_cur_0 = tmp - 1;
                p_regs->sw28.ref_invd_cur_0 = 512 / (tmp - 1);
            }
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;

            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< this will become "future to previous past" for next B
            p_hal->future2prev_past_dist = tmp;
            if (p_hal->first_field) {
                p_regs->sw31.ref_dist_cur_2 = tmp - 1;
                p_regs->sw31.ref_dist_cur_3 = tmp;

                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp - 1);
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            } else {
                p_regs->sw31.ref_dist_cur_3 = tmp;
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            }

            p_regs->sw32.ref_invd_col_0 = 0;
            p_regs->sw32.ref_invd_col_1 = 0;
            p_regs->sw33.ref_invd_col_2 = 0;
            p_regs->sw33.ref_invd_col_3 = 0;
        }
    }

    p_regs->sw48.startmb_x = 0;
    p_regs->sw48.startmb_y = 0;

    p_regs->sw03.filtering_dis = p_syn->pp.loopFilterDisable;
    p_regs->sw05.alpha_offset = p_syn->pp.alphaOffset;
    p_regs->sw05.beta_offset = p_syn->pp.betaOffset;
    p_regs->sw03.skip_mode = p_syn->pp.skipModeFlag;
    p_regs->sw04.pic_refer_flag = p_syn->pp.pictureReferenceFlag;

    if (p_syn->pp.picCodingType == PFRAME
        || (p_syn->pp.picCodingType == IFRAME && !p_hal->first_field)) {
        p_regs->sw03.write_mvs_e = 1;
    } else {
        p_regs->sw03.write_mvs_e = 0;
    }
    //!< set mv base
    p_regs->sw41.dir_mv_base = mpp_buffer_get_fd(p_hal->mv_buf);
    if (p_hal->first_field ||
        (p_syn->pp.picCodingType == BFRAME && p_hal->prev_pic_structure)) {
    } else {
        RK_U32 frame_width = 0, frame_height = 0, offset = 0;
        frame_width = (p_syn->pp.horizontalSize + 15) >> 4;
        if (p_syn->pp.progressiveFrame)
            frame_height = (p_syn->pp.verticalSize + 15) >> 4;
        else
            frame_height = 2 * ((p_syn->pp.verticalSize + 31) >> 5);
        offset = MPP_ALIGN(frame_width * frame_height / 2, 2) * 16;
        mpp_dev_set_reg_offset(p_hal->dev, 41, offset);
    }
    {
        RK_U32 pic_type = 0;
        RK_U32 prev_anc_type = 0;
        if (p_hal->work0 >= 0) {
            pic_type = p_hal->pic[p_hal->work0].pic_type;
        }
        prev_anc_type = !pic_type || (!p_hal->first_field && !p_hal->prev_pic_structure);
        p_regs->sw18.prev_anc_type = prev_anc_type;
    }
    //!< b-picture needs to know if future reference is field or frame coded
    // p_regs->sw16.refer2_field_e = (!p_hal->prev_pic_structure) ? 1 : 0;
    // p_regs->sw17.refer3_field_e = (!p_hal->prev_pic_structure) ? 1 : 0;
    if (!p_hal->prev_pic_structure) {
        mpp_dev_set_reg_offset(p_hal->dev, 16, 2);
        mpp_dev_set_reg_offset(p_hal->dev, 17, 3);
    }

    p_regs->sw03.dec_out_dis = 0;
    p_regs->sw01.dec_e = 1;

    return MPP_OK;
__FAILED:
    return ret;
}